

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O3

void __thiscall
duckdb::TableStatistics::InitializeAddConstraint(TableStatistics *this,TableStatistics *parent)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  reference __x;
  size_type __n;
  
  shared_ptr<std::mutex,_true>::operator=(&this->stats_lock,&parent->stats_lock);
  __mutex = (pthread_mutex_t *)shared_ptr<std::mutex,_true>::operator*(&this->stats_lock);
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    if ((parent->column_stats).
        super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
        .
        super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (parent->column_stats).
        super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
        .
        super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
      do {
        __x = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                        (&parent->column_stats,__n);
        ::std::
        vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
        ::push_back(&(this->column_stats).
                     super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                    ,__x);
        __n = __n + 1;
      } while (__n < (ulong)((long)(parent->column_stats).
                                   super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(parent->column_stats).
                                   super_vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                                   .
                                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void TableStatistics::InitializeAddConstraint(TableStatistics &parent) {
	D_ASSERT(Empty());
	D_ASSERT(parent.stats_lock);

	stats_lock = parent.stats_lock;
	lock_guard<mutex> lock(*stats_lock);
	for (idx_t i = 0; i < parent.column_stats.size(); i++) {
		column_stats.push_back(parent.column_stats[i]);
	}
}